

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::FindObjectHelper<true,true>
              (RecyclableObject *obj,int64 length,int64 start,RecyclableObject *callBackFn,
              Var thisArg,ScriptContext *scriptContext)

{
  undefined8 scriptContext_00;
  bool bVar1;
  BOOL BVar2;
  ThreadContext *pTVar3;
  Var pvVar4;
  JavascriptMethod p_Var5;
  CallInfo local_d8;
  CallInfo local_d0;
  undefined1 local_c8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var index;
  uint32 k;
  int8 loopDelta;
  uint32 loopStart;
  Var testResult;
  Var element;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Var thisArg_local;
  RecyclableObject *callBackFn_local;
  int64 start_local;
  int64 length_local;
  RecyclableObject *obj_local;
  RecyclableObject *local_18;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_80,pTVar3);
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,obj);
  index._4_4_ = (uint)length;
  do {
    scriptContext_00 = jsReentLock._24_8_;
    index._4_4_ = index._4_4_ - 1;
    if (length <= (long)(ulong)index._4_4_) {
      bVar1 = TaggedInt::IsOverflow(-1);
      if (bVar1) {
        local_18 = (RecyclableObject *)
                   JavascriptNumber::NewInlined(-1.0,(ScriptContext *)scriptContext_00);
      }
      else {
        local_18 = (RecyclableObject *)TaggedInt::ToVarUnchecked(-1);
      }
      obj_local = local_18;
      goto LAB_01118005;
    }
    JsReentLock::unlock((JsReentLock *)local_80);
    pvVar4 = Js::JavascriptOperators::GetItem(obj,index._4_4_,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    JsReentLock::relock((JsReentLock *)local_80);
    autoReentrancyHandler._8_8_ =
         JavascriptNumber::ToVar(index._4_4_,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::unlock((JsReentLock *)local_80);
    pTVar3 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c8,pTVar3);
    pTVar3 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar3);
    pTVar3 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    ThreadContext::AssertJsReentrancy(pTVar3);
    p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
    CheckIsExecutable(callBackFn,p_Var5);
    p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
    CallInfo::CallInfo(&local_d0,CallFlags_Value,4);
    CallInfo::CallInfo(&local_d8,CallFlags_Value,4);
    pvVar4 = (*p_Var5)(callBackFn,(CallInfo)callBackFn,local_d0,0,0,0,0,local_d8,thisArg,pvVar4,
                       autoReentrancyHandler._8_8_,obj);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c8);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    JsReentLock::relock((JsReentLock *)local_80);
    BVar2 = JavascriptConversion::ToBoolean(pvVar4,(ScriptContext *)jsReentLock._24_8_);
  } while (BVar2 == 0);
  obj_local = (RecyclableObject *)autoReentrancyHandler._8_8_;
LAB_01118005:
  JsReentLock::~JsReentLock((JsReentLock *)local_80);
  return obj_local;
}

Assistant:

Var JavascriptArray::FindObjectHelper(RecyclableObject* obj, int64 length, int64 start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : (uint32)start;
        int8 loopDelta = reversed ? -1 : 1;

        for (uint32 k = loopStart; k < length; k += loopDelta)
        {
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, k, scriptContext));
            Var index = JavascriptNumber::ToVar(k, scriptContext);

            JS_REENTRANT(jsReentLock,
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                            element,
                            index,
                            obj);
                }
                END_SAFE_REENTRANT_CALL
            );

            if (JavascriptConversion::ToBoolean(testResult, scriptContext))
            {
                return findIndex ? index : element;
            }
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }